

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugi.cpp
# Opt level: O2

bool nullcInitPugiXMLModule(void)

{
  nullres nVar1;
  
  nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCPugiXML::xml_parse_result*>
                    ("ext.pugixml",NULLCPugiXML::description,"xml_parse_result::description",0);
  if ((((((((nVar1 != '\0') &&
           (nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_parse_result*,NULLCArray,unsigned_int,NULLCPugiXML::xml_document*>
                              ("ext.pugixml",NULLCPugiXML::xml_document__load,"xml_document::load",0
                              ), nVar1 != '\0')) &&
          (nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_parse_result*,NULLCArray,unsigned_int,pugi::xml_encoding,NULLCPugiXML::xml_document*>
                             ("ext.pugixml",NULLCPugiXML::xml_document__load_file,
                              "xml_document::load_file",0), nVar1 != '\0')) &&
         (((nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_parse_result*,NULLCArray,int,unsigned_int,pugi::xml_encoding,NULLCPugiXML::xml_document*>
                              ("ext.pugixml",NULLCPugiXML::xml_document__load_buffer,
                               "xml_document::load_buffer",0), nVar1 != '\0' &&
           (nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_parse_result*,NULLCArray,int,unsigned_int,pugi::xml_encoding,NULLCPugiXML::xml_document*>
                              ("ext.pugixml",NULLCPugiXML::xml_document__load_buffer_inplace,
                               "xml_document::load_buffer_inplace",0), nVar1 != '\0')) &&
          ((nVar1 = nullcBindModuleFunctionHelper<void,NULLCFuncPtr,NULLCArray,int,pugi::xml_encoding,NULLCPugiXML::xml_document*>
                              ("ext.pugixml",NULLCPugiXML::xml_document__save,"xml_document::save",0
                              ), nVar1 != '\0' &&
           ((nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,NULLCArray,int,pugi::xml_encoding,NULLCPugiXML::xml_document*>
                               ("ext.pugixml",NULLCPugiXML::xml_document__save_file,
                                "xml_document::save_file",0), nVar1 != '\0' &&
            (nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCPugiXML::xml_document*>
                               ("ext.pugixml",NULLCPugiXML::xml_document__root,"xml_document::root",
                                0), nVar1 != '\0')))))))) &&
        (nVar1 = nullcBindModuleFunctionHelper<void,NULLCPugiXML::xml_document_impl*>
                           ("ext.pugixml",NULLCPugiXML::xml_document__finalize,
                            "xml_document_impl::finalize",0), nVar1 != '\0')) &&
       (((nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*>
                            ("ext.pugixml",NULLCPugiXML::xml_attribute__next_attribute,
                             "xml_attribute::next_attribute",0), nVar1 != '\0' &&
         (nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*>
                            ("ext.pugixml",NULLCPugiXML::xml_attribute__previous_attribute,
                             "xml_attribute::previous_attribute",0), nVar1 != '\0')) &&
        (nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_attribute*>
                           ("ext.pugixml",NULLCPugiXML::xml_attribute__as_int,
                            "xml_attribute::as_int",0), nVar1 != '\0')))) &&
      (((nVar1 = nullcBindModuleFunctionHelper<double,NULLCPugiXML::xml_attribute*>
                           ("ext.pugixml",NULLCPugiXML::xml_attribute__as_double,
                            "xml_attribute::as_double",0), nVar1 != '\0' &&
        (nVar1 = nullcBindModuleFunctionHelper<float,NULLCPugiXML::xml_attribute*>
                           ("ext.pugixml",NULLCPugiXML::xml_attribute__as_float,
                            "xml_attribute::as_float",0), nVar1 != '\0')) &&
       (((nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_attribute*>
                            ("ext.pugixml",NULLCPugiXML::xml_attribute__as_bool,
                             "xml_attribute::as_bool",0), nVar1 != '\0' &&
         ((nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,NULLCPugiXML::xml_attribute*>
                             ("ext.pugixml",NULLCPugiXML::xml_attribute__set_name,
                              "xml_attribute::set_name",0), nVar1 != '\0' &&
          (nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,NULLCPugiXML::xml_attribute*>
                             ("ext.pugixml",NULLCPugiXML::xml_attribute__set_valueS,
                              "xml_attribute::set_value",0), nVar1 != '\0')))) &&
        (nVar1 = nullcBindModuleFunctionHelper<int,int,NULLCPugiXML::xml_attribute*>
                           ("ext.pugixml",NULLCPugiXML::xml_attribute__set_valueI,
                            "xml_attribute::set_value",1), nVar1 != '\0')))))) &&
     (nVar1 = nullcBindModuleFunctionHelper<int,double,NULLCPugiXML::xml_attribute*>
                        ("ext.pugixml",NULLCPugiXML::xml_attribute__set_valueD,
                         "xml_attribute::set_value",2), nVar1 != '\0')) {
    nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_attribute*>
                      ("ext.pugixml",NULLCPugiXML::xml_attribute__empty,"xml_attribute::empty",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCPugiXML::xml_attribute*>
                      ("ext.pugixml",NULLCPugiXML::xml_attribute__name,"xml_attribute::name",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCPugiXML::xml_attribute*>
                      ("ext.pugixml",NULLCPugiXML::xml_attribute__value,"xml_attribute::value",0);
    if (nVar1 == '\0') {
      return false;
    }
    nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*,NULLCArray>
                      ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorSetS,"=",1);
    if (((nVar1 != '\0') &&
        (nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*,int>
                           ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorSetI,"=",2),
        nVar1 != '\0')) &&
       (nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*,double>
                          ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorSetD,"=",3),
       nVar1 != '\0')) {
      nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_attribute*>
                        ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorNot,"!",0);
      if (nVar1 == '\0') {
        return false;
      }
      nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                        ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorEqual,"==",3);
      if ((nVar1 != '\0') &&
         (nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                            ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorNEqual,"!=",3),
         nVar1 != '\0')) {
        nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                          ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorLess,"<",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                          ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorGreater,">",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                          ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorLEqual,"<=",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*>
                          ("ext.pugixml",NULLCPugiXML::xml_attribute__operatorGEqual,">=",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_node*>
                          ("ext.pugixml",NULLCPugiXML::xml_node__empty,"xml_node::empty",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<pugi::xml_node_type,NULLCPugiXML::xml_node*>
                          ("ext.pugixml",NULLCPugiXML::xml_node__type,"xml_node::type",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCPugiXML::xml_node*>
                          ("ext.pugixml",NULLCPugiXML::xml_node__name,"xml_node::name",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCPugiXML::xml_node*>
                          ("ext.pugixml",NULLCPugiXML::xml_node__value,"xml_node::value",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*>
                          ("ext.pugixml",NULLCPugiXML::xml_node__child,"xml_node::child",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCArray,NULLCPugiXML::xml_node*>
                          ("ext.pugixml",NULLCPugiXML::xml_node__attribute,"xml_node::attribute",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*>
                          ("ext.pugixml",NULLCPugiXML::xml_node__next_sibling0,
                           "xml_node::next_sibling",0);
        if (nVar1 == '\0') {
          return false;
        }
        nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>
                          ("ext.pugixml",NULLCPugiXML::xml_node__next_sibling1,
                           "xml_node::next_sibling",1);
        if (nVar1 != '\0') {
          nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*>
                            ("ext.pugixml",NULLCPugiXML::xml_node__previous_sibling0,
                             "xml_node::previous_sibling",0);
          if (nVar1 == '\0') {
            return false;
          }
          nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>
                            ("ext.pugixml",NULLCPugiXML::xml_node__previous_sibling1,
                             "xml_node::previous_sibling",1);
          if (nVar1 != '\0') {
            nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>
                              ("ext.pugixml",NULLCPugiXML::xml_node__parent,"xml_node::parent",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>
                              ("ext.pugixml",NULLCPugiXML::xml_node__root,"xml_node::root",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCPugiXML::xml_node*>
                              ("ext.pugixml",NULLCPugiXML::xml_node__child_value0,
                               "xml_node::child_value",0);
            if (nVar1 == '\0') {
              return false;
            }
            nVar1 = nullcBindModuleFunctionHelper<NULLCArray,NULLCArray,NULLCPugiXML::xml_node*>
                              ("ext.pugixml",NULLCPugiXML::xml_node__child_value1,
                               "xml_node::child_value",1);
            if (nVar1 != '\0') {
              nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__set_name,"xml_node::set_name"
                                 ,0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<int,NULLCArray,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__set_value,
                                 "xml_node::set_value",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCArray,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__append_attribute,
                                 "xml_node::append_attribute",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCArray,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__prepend_attribute,
                                 "xml_node::prepend_attribute",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCArray,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_attribute_after,
                                 "xml_node::insert_attribute_after",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCArray,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_attribute_before,
                                 "xml_node::insert_attribute_before",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__append_copy0,
                                 "xml_node::append_copy",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__prepend_copy0,
                                 "xml_node::prepend_copy",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_copy_after0,
                                 "xml_node::insert_copy_after",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_copy_before0,
                                 "xml_node::insert_copy_before",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,pugi::xml_node_type,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__append_child,
                                 "xml_node::append_child",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,pugi::xml_node_type,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__prepend_child,
                                 "xml_node::prepend_child",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,pugi::xml_node_type,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_child_after,
                                 "xml_node::insert_child_after",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,pugi::xml_node_type,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__insert_child_before,
                                 "xml_node::insert_child_before",0);
              if (nVar1 == '\0') {
                return false;
              }
              nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*>
                                ("ext.pugixml",NULLCPugiXML::xml_node__append_child1,
                                 "xml_node::append_child",1);
              if (((nVar1 != '\0') &&
                  (nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*>
                                     ("ext.pugixml",NULLCPugiXML::xml_node__prepend_child1,
                                      "xml_node::prepend_child",1), nVar1 != '\0')) &&
                 ((nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                     ("ext.pugixml",NULLCPugiXML::xml_node__insert_child_after1,
                                      "xml_node::insert_child_after",1), nVar1 != '\0' &&
                  ((((nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCArray,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                        ("ext.pugixml",NULLCPugiXML::xml_node__insert_child_before1,
                                         "xml_node::insert_child_before",1), nVar1 != '\0' &&
                     (nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                        ("ext.pugixml",NULLCPugiXML::xml_node__append_copy1,
                                         "xml_node::append_copy",1), nVar1 != '\0')) &&
                    (nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                       ("ext.pugixml",NULLCPugiXML::xml_node__prepend_copy1,
                                        "xml_node::prepend_copy",1), nVar1 != '\0')) &&
                   ((nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                       ("ext.pugixml",NULLCPugiXML::xml_node__insert_copy_after1,
                                        "xml_node::insert_copy_after",1), nVar1 != '\0' &&
                    (nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                       ("ext.pugixml",NULLCPugiXML::xml_node__insert_copy_before1,
                                        "xml_node::insert_copy_before",1), nVar1 != '\0')))))))) {
                nVar1 = nullcBindModuleFunctionHelper<void,NULLCPugiXML::xml_attribute*,NULLCPugiXML::xml_node*>
                                  ("ext.pugixml",NULLCPugiXML::xml_node__remove_attribute0,
                                   "xml_node::remove_attribute",0);
                if (nVar1 == '\0') {
                  return false;
                }
                nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,NULLCPugiXML::xml_node*>
                                  ("ext.pugixml",NULLCPugiXML::xml_node__remove_attribute1,
                                   "xml_node::remove_attribute",1);
                if (nVar1 != '\0') {
                  nVar1 = nullcBindModuleFunctionHelper<void,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                    ("ext.pugixml",NULLCPugiXML::xml_node__remove_child0,
                                     "xml_node::remove_child",0);
                  if (nVar1 == '\0') {
                    return false;
                  }
                  nVar1 = nullcBindModuleFunctionHelper<void,NULLCArray,NULLCPugiXML::xml_node*>
                                    ("ext.pugixml",NULLCPugiXML::xml_node__remove_child1,
                                     "xml_node::remove_child",1);
                  if (nVar1 != '\0') {
                    nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_node*>
                                      ("ext.pugixml",NULLCPugiXML::xml_node__first_attribute,
                                       "xml_node::first_attribute",0);
                    if (nVar1 == '\0') {
                      return false;
                    }
                    nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCPugiXML::xml_node*>
                                      ("ext.pugixml",NULLCPugiXML::xml_node__last_attribute,
                                       "xml_node::last_attribute",0);
                    if (nVar1 == '\0') {
                      return false;
                    }
                    nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>
                                      ("ext.pugixml",NULLCPugiXML::xml_node__first_child,
                                       "xml_node::first_child",0);
                    if (nVar1 == '\0') {
                      return false;
                    }
                    nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCPugiXML::xml_node*>
                                      ("ext.pugixml",NULLCPugiXML::xml_node__last_child,
                                       "xml_node::last_child",0);
                    if (nVar1 == '\0') {
                      return false;
                    }
                    nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCArray,NULLCArray,NULLCArray,NULLCPugiXML::xml_node*>
                                      ("ext.pugixml",
                                       NULLCPugiXML::xml_node__find_child_by_attribute0,
                                       "xml_node::find_child_by_attribute",0);
                    if (nVar1 == '\0') {
                      return false;
                    }
                    nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCArray,NULLCArray,NULLCPugiXML::xml_node*>
                                      ("ext.pugixml",
                                       NULLCPugiXML::xml_node__find_child_by_attribute1,
                                       "xml_node::find_child_by_attribute",1);
                    if (nVar1 != '\0') {
                      nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCArray,char,NULLCPugiXML::xml_node*>
                                        ("ext.pugixml",NULLCPugiXML::xml_node__first_element_by_path
                                         ,"xml_node::first_element_by_path",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_node*>
                                        ("ext.pugixml",NULLCPugiXML::xml_node__offset_debug,
                                         "xml_node::offset_debug",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionHelper<int,NULLCFuncPtr,NULLCFuncPtr,NULLCFuncPtr,NULLCPugiXML::xml_node*>
                                        ("ext.pugixml",NULLCPugiXML::xml_node__traverse,
                                         "xml_node::traverse",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionHelper<void,NULLCFuncPtr,NULLCArray,int,pugi::xml_encoding,int,NULLCPugiXML::xml_node*>
                                        ("ext.pugixml",NULLCPugiXML::xml_node__print,
                                         "xml_node::print",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_attribute,NULLCFuncPtr,NULLCPugiXML::xml_node*>
                                        ("ext.pugixml",NULLCPugiXML::xml_node__find_attribute,
                                         "xml_node::find_attribute",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCFuncPtr,NULLCPugiXML::xml_node*>
                                        ("ext.pugixml",NULLCPugiXML::xml_node__find_child,
                                         "xml_node::find_child",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionHelper<NULLCPugiXML::xml_node,NULLCFuncPtr,NULLCPugiXML::xml_node*>
                                        ("ext.pugixml",NULLCPugiXML::xml_node__find_node,
                                         "xml_node::find_node",0);
                      if (nVar1 == '\0') {
                        return false;
                      }
                      nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_node*>
                                        ("ext.pugixml",NULLCPugiXML::xml_node__operatorNot,"!",1);
                      if (((nVar1 != '\0') &&
                          (nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                             ("ext.pugixml",NULLCPugiXML::xml_node__operatorEqual,
                                              "==",4), nVar1 != '\0')) &&
                         ((nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                             ("ext.pugixml",NULLCPugiXML::xml_node__operatorNEqual,
                                              "!=",4), nVar1 != '\0' &&
                          (((nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                               ("ext.pugixml",NULLCPugiXML::xml_node__operatorLess,
                                                "<",1), nVar1 != '\0' &&
                            (nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                               ("ext.pugixml",
                                                NULLCPugiXML::xml_node__operatorGreater,">",1),
                            nVar1 != '\0')) &&
                           (nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                              ("ext.pugixml",NULLCPugiXML::xml_node__operatorLEqual,
                                               "<=",1), nVar1 != '\0')))))) {
                        nVar1 = nullcBindModuleFunctionHelper<int,NULLCPugiXML::xml_node*,NULLCPugiXML::xml_node*>
                                          ("ext.pugixml",NULLCPugiXML::xml_node__operatorGEqual,">="
                                           ,1);
                        return nVar1 != '\0';
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return false;
}

Assistant:

bool	nullcInitPugiXMLModule()
{
	REGISTER_FUNC(description, "xml_parse_result::description", 0);

	REGISTER_FUNC(xml_document__load, "xml_document::load", 0);
	REGISTER_FUNC(xml_document__load_file, "xml_document::load_file", 0);
	REGISTER_FUNC(xml_document__load_buffer, "xml_document::load_buffer", 0);
	REGISTER_FUNC(xml_document__load_buffer_inplace, "xml_document::load_buffer_inplace", 0);
	REGISTER_FUNC(xml_document__save, "xml_document::save", 0);
	REGISTER_FUNC(xml_document__save_file, "xml_document::save_file", 0);

	REGISTER_FUNC(xml_document__root, "xml_document::root", 0);

	REGISTER_FUNC(xml_document__finalize, "xml_document_impl::finalize", 0);

	REGISTER_FUNC(xml_attribute__next_attribute, "xml_attribute::next_attribute", 0);
	REGISTER_FUNC(xml_attribute__previous_attribute, "xml_attribute::previous_attribute", 0);
	REGISTER_FUNC(xml_attribute__as_int, "xml_attribute::as_int", 0);
	REGISTER_FUNC(xml_attribute__as_double, "xml_attribute::as_double", 0);
	REGISTER_FUNC(xml_attribute__as_float, "xml_attribute::as_float", 0);
	REGISTER_FUNC(xml_attribute__as_bool, "xml_attribute::as_bool", 0);
	REGISTER_FUNC(xml_attribute__set_name, "xml_attribute::set_name", 0);
	REGISTER_FUNC(xml_attribute__set_valueS, "xml_attribute::set_value", 0);
	REGISTER_FUNC(xml_attribute__set_valueI, "xml_attribute::set_value", 1);
	REGISTER_FUNC(xml_attribute__set_valueD, "xml_attribute::set_value", 2);
	REGISTER_FUNC(xml_attribute__empty, "xml_attribute::empty", 0);
	REGISTER_FUNC(xml_attribute__name, "xml_attribute::name", 0);
	REGISTER_FUNC(xml_attribute__value, "xml_attribute::value", 0);

	REGISTER_FUNC(xml_attribute__operatorSetS, "=", 1);
	REGISTER_FUNC(xml_attribute__operatorSetI, "=", 2);
	REGISTER_FUNC(xml_attribute__operatorSetD, "=", 3);
	
	REGISTER_FUNC(xml_attribute__operatorNot, "!", 0);
	REGISTER_FUNC(xml_attribute__operatorEqual, "==", 3);
	REGISTER_FUNC(xml_attribute__operatorNEqual, "!=", 3);
	REGISTER_FUNC(xml_attribute__operatorLess, "<", 0);
	REGISTER_FUNC(xml_attribute__operatorGreater, ">", 0);
	REGISTER_FUNC(xml_attribute__operatorLEqual, "<=", 0);
	REGISTER_FUNC(xml_attribute__operatorGEqual, ">=", 0);

	REGISTER_FUNC(xml_node__empty, "xml_node::empty", 0);
	REGISTER_FUNC(xml_node__type, "xml_node::type", 0);
	REGISTER_FUNC(xml_node__name, "xml_node::name", 0);
	REGISTER_FUNC(xml_node__value, "xml_node::value", 0);
	REGISTER_FUNC(xml_node__child, "xml_node::child", 0);
	REGISTER_FUNC(xml_node__attribute, "xml_node::attribute", 0);
	REGISTER_FUNC(xml_node__next_sibling0, "xml_node::next_sibling", 0);
	REGISTER_FUNC(xml_node__next_sibling1, "xml_node::next_sibling", 1);
	REGISTER_FUNC(xml_node__previous_sibling0, "xml_node::previous_sibling", 0);
	REGISTER_FUNC(xml_node__previous_sibling1, "xml_node::previous_sibling", 1);
	REGISTER_FUNC(xml_node__parent, "xml_node::parent", 0);
	REGISTER_FUNC(xml_node__root, "xml_node::root", 0);
	REGISTER_FUNC(xml_node__child_value0, "xml_node::child_value", 0);
	REGISTER_FUNC(xml_node__child_value1, "xml_node::child_value", 1);
	REGISTER_FUNC(xml_node__set_name, "xml_node::set_name", 0);
	REGISTER_FUNC(xml_node__set_value, "xml_node::set_value", 0);

	REGISTER_FUNC(xml_node__append_attribute, "xml_node::append_attribute", 0);
	REGISTER_FUNC(xml_node__prepend_attribute, "xml_node::prepend_attribute", 0);
	REGISTER_FUNC(xml_node__insert_attribute_after, "xml_node::insert_attribute_after", 0);
	REGISTER_FUNC(xml_node__insert_attribute_before, "xml_node::insert_attribute_before", 0);

	REGISTER_FUNC(xml_node__append_copy0, "xml_node::append_copy", 0);
	REGISTER_FUNC(xml_node__prepend_copy0, "xml_node::prepend_copy", 0);
	REGISTER_FUNC(xml_node__insert_copy_after0, "xml_node::insert_copy_after", 0);
	REGISTER_FUNC(xml_node__insert_copy_before0, "xml_node::insert_copy_before", 0);

	REGISTER_FUNC(xml_node__append_child, "xml_node::append_child", 0);
	REGISTER_FUNC(xml_node__prepend_child, "xml_node::prepend_child", 0);
	REGISTER_FUNC(xml_node__insert_child_after, "xml_node::insert_child_after", 0);
	REGISTER_FUNC(xml_node__insert_child_before, "xml_node::insert_child_before", 0);

	REGISTER_FUNC(xml_node__append_child1, "xml_node::append_child", 1);
	REGISTER_FUNC(xml_node__prepend_child1, "xml_node::prepend_child", 1);
	REGISTER_FUNC(xml_node__insert_child_after1, "xml_node::insert_child_after", 1);
	REGISTER_FUNC(xml_node__insert_child_before1, "xml_node::insert_child_before", 1);

	REGISTER_FUNC(xml_node__append_copy1, "xml_node::append_copy", 1);
	REGISTER_FUNC(xml_node__prepend_copy1, "xml_node::prepend_copy", 1);
	REGISTER_FUNC(xml_node__insert_copy_after1, "xml_node::insert_copy_after", 1);
	REGISTER_FUNC(xml_node__insert_copy_before1, "xml_node::insert_copy_before", 1);

	REGISTER_FUNC(xml_node__remove_attribute0, "xml_node::remove_attribute", 0);
	REGISTER_FUNC(xml_node__remove_attribute1, "xml_node::remove_attribute", 1);
	REGISTER_FUNC(xml_node__remove_child0, "xml_node::remove_child", 0);
	REGISTER_FUNC(xml_node__remove_child1, "xml_node::remove_child", 1);
	REGISTER_FUNC(xml_node__first_attribute, "xml_node::first_attribute", 0);
    REGISTER_FUNC(xml_node__last_attribute, "xml_node::last_attribute", 0);
	REGISTER_FUNC(xml_node__first_child, "xml_node::first_child", 0);
    REGISTER_FUNC(xml_node__last_child, "xml_node::last_child", 0);
	REGISTER_FUNC(xml_node__find_child_by_attribute0, "xml_node::find_child_by_attribute", 0);
	REGISTER_FUNC(xml_node__find_child_by_attribute1, "xml_node::find_child_by_attribute", 1);
	REGISTER_FUNC(xml_node__first_element_by_path, "xml_node::first_element_by_path", 0);
	REGISTER_FUNC(xml_node__offset_debug, "xml_node::offset_debug", 0);

	REGISTER_FUNC(xml_node__traverse, "xml_node::traverse", 0);
	REGISTER_FUNC(xml_node__print, "xml_node::print", 0);

	REGISTER_FUNC(xml_node__find_attribute, "xml_node::find_attribute", 0);
	REGISTER_FUNC(xml_node__find_child, "xml_node::find_child", 0);
	REGISTER_FUNC(xml_node__find_node, "xml_node::find_node", 0);

	REGISTER_FUNC(xml_node__operatorNot, "!", 1);
	REGISTER_FUNC(xml_node__operatorEqual, "==", 4);
	REGISTER_FUNC(xml_node__operatorNEqual, "!=", 4);
	REGISTER_FUNC(xml_node__operatorLess, "<", 1);
	REGISTER_FUNC(xml_node__operatorGreater, ">", 1);
	REGISTER_FUNC(xml_node__operatorLEqual, "<=", 1);
	REGISTER_FUNC(xml_node__operatorGEqual, ">=", 1);

	return true;
}